

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestFieldOrderings::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  string_view value;
  uint uVar1;
  TestFieldOrderings **v1;
  TestFieldOrderings **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena_00;
  TestFieldOrderings_NestedMessage *pTVar4;
  anon_union_64_1_493b367e_for_TestFieldOrderings_3 *this;
  TestFieldOrderings *pTVar5;
  LogMessage local_d0;
  Voidify local_b9;
  string_view local_b8;
  uint local_a8;
  uint32_t cached_has_bits;
  LogMessage local_98;
  Voidify local_81;
  TestFieldOrderings *local_80;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestFieldOrderings *from;
  TestFieldOrderings *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_40;
  size_t local_38;
  char *local_30;
  TestFieldOrderings *local_28;
  size_t local_20;
  char *local_18;
  anon_union_64_1_493b367e_for_TestFieldOrderings_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestFieldOrderings *)to_msg;
  _this = (TestFieldOrderings *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_80 = (TestFieldOrderings *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestFieldOrderings_const*>(&local_80);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestFieldOrderings*>(&from);
  local_78 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestFieldOrderings_const*,edition_unittest::TestFieldOrderings*>
                       (v1,v2,"&from != _this");
  if (local_78 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_78);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x6ca1,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_98);
  }
  local_a8 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).first_owner_,0);
  pTVar5 = from;
  local_a8 = *puVar3;
  if ((local_a8 & 0xf) != 0) {
    if ((local_a8 & 1) != 0) {
      local_b8 = _internal_my_string((TestFieldOrderings *)arena);
      local_20 = local_b8._M_len;
      local_18 = local_b8._M_str;
      local_28 = pTVar5;
      local_10 = &pTVar5->field_0;
      puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar5->field_0)._impl_._has_bits_,0);
      *puVar3 = *puVar3 | 1;
      local_38 = local_20;
      local_30 = local_18;
      arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar5);
      value._M_str = local_30;
      value._M_len = local_38;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar5->field_0)._impl_.my_string_,value,arena_00);
    }
    if ((local_a8 & 2) != 0) {
      if ((arena->impl_).first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x6cab,"from._impl_.optional_nested_message_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_b9,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_d0);
      }
      if ((from->field_0)._impl_.optional_nested_message_ == (TestFieldOrderings_NestedMessage *)0x0
         ) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.limit_;
        local_40 = absl_log_internal_check_op_result;
        pTVar4 = (TestFieldOrderings_NestedMessage *)
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestFieldOrderings_NestedMessage>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.optional_nested_message_ = pTVar4;
      }
      else {
        TestFieldOrderings_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_nested_message_,
                   (TestFieldOrderings_NestedMessage *)(arena->impl_).first_arena_.limit_);
      }
    }
    if ((local_a8 & 4) != 0) {
      (from->field_0)._impl_.my_int_ = (int64_t)(arena->impl_).first_arena_.prefetch_ptr_;
    }
    if ((local_a8 & 8) != 0) {
      (from->field_0)._impl_.my_float_ = *(float *)&(arena->impl_).first_arena_.cleanup_list_.head_;
    }
  }
  uVar1 = local_a8;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  this = &from->field_0;
  pTVar5 = default_instance();
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(this->_impl_)._extensions_,(MessageLite *)pTVar5,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestFieldOrderings::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestFieldOrderings*>(&to_msg);
  auto& from = static_cast<const TestFieldOrderings&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestFieldOrderings)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_my_string(from._internal_my_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.my_int_ = from._impl_.my_int_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.my_float_ = from._impl_.my_float_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}